

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

string * __thiscall
QPDFJob::json_out_schema_abi_cxx11_(string *__return_storage_ptr__,QPDFJob *this,int version)

{
  JSON local_20;
  
  json_schema((QPDFJob *)&local_20,(int)this,
              (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)0x0);
  JSON::unparse_abi_cxx11_(__return_storage_ptr__,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFJob::json_out_schema(int version)
{
    return json_schema(version).unparse();
}